

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t ComputeShortestPathFromNodes(size_t num_bytes,ZopfliNode *nodes)

{
  anon_union_4_3_cc401a1e_for_u *paVar1;
  size_t sVar2;
  uint uVar3;
  
  for (paVar1 = &nodes[num_bytes].u;
      (paVar1[-1].next == 0 && (((ZopfliNode *)(paVar1 + -3))->length == 1)); paVar1 = paVar1 + -4)
  {
    num_bytes = num_bytes - 1;
  }
  paVar1->next = 0xffffffff;
  sVar2 = 0;
  while (num_bytes != 0) {
    uVar3 = (nodes[num_bytes].length & 0xffffff) + nodes[num_bytes].insert_length;
    num_bytes = num_bytes - uVar3;
    nodes[num_bytes].u.next = uVar3;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t ComputeShortestPathFromNodes(size_t num_bytes,
    ZopfliNode* nodes) {
  size_t index = num_bytes;
  size_t num_commands = 0;
  while (nodes[index].insert_length == 0 && nodes[index].length == 1) --index;
  nodes[index].u.next = BROTLI_UINT32_MAX;
  while (index != 0) {
    size_t len = ZopfliNodeCommandLength(&nodes[index]);
    index -= len;
    nodes[index].u.next = (uint32_t)len;
    num_commands++;
  }
  return num_commands;
}